

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O1

void google::protobuf::util::anon_unknown_0::ConvertOptionField
               (Reflection *reflection,Message *options,FieldDescriptor *field,int index,Option *out
               )

{
  byte bVar1;
  int iVar2;
  int32_t iVar3;
  uint32_t uVar4;
  Any *pAVar5;
  Message *message;
  uint64_t uVar6;
  EnumValueDescriptor *pEVar7;
  size_type sVar8;
  string *psVar9;
  undefined8 extraout_RAX;
  bool bVar10;
  Arena *pAVar11;
  _Alloc_hider _Var12;
  float fVar13;
  Int32Value wrapper;
  undefined1 local_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  double local_90;
  undefined1 local_88 [32];
  string local_68;
  undefined1 local_48 [32];
  
  pAVar11 = (Arena *)(out->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar11 & 1) != 0) {
    pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>
            (&(out->field_0)._impl_.name_,
             (string *)
             ((long)&(field->all_names_->_M_dataplus)._M_p +
             (ulong)(((byte)field->field_0x1 & 8) << 2)),pAVar11);
  *(byte *)&out->field_0 = *(byte *)&out->field_0 | 1;
  if ((out->field_0)._impl_.value_ == (Any *)0x0) {
    pAVar11 = (Arena *)(out->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar11 & 1) != 0) {
      pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
    }
    pAVar5 = (Any *)Arena::DefaultConstruct<google::protobuf::Any>(pAVar11);
    (out->field_0)._impl_.value_ = pAVar5;
  }
  if (9 < *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) - 1U) {
    return;
  }
  pAVar5 = (out->field_0)._impl_.value_;
  switch(*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
  case 1:
    bVar1 = field->field_0x1;
    bVar10 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar10) {
      psVar9 = (string *)0x0;
    }
    else {
      psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                         (bVar10,0xbf < bVar1,"is_repeated_ == label() == LABEL_REPEATED");
    }
    if (psVar9 == (string *)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        iVar3 = Reflection::GetInt32(reflection,options,field);
      }
      else {
        iVar3 = Reflection::GetRepeatedInt32(reflection,options,field,index);
      }
      Int32Value::Int32Value((Int32Value *)local_b0,(Arena *)0x0);
      local_a0._M_allocated_capacity._0_4_ = iVar3;
      Any::PackFrom(pAVar5,(Message *)local_b0);
LAB_0032f862:
      Int32Value::~Int32Value((Int32Value *)local_b0);
      return;
    }
    goto LAB_0032fbe2;
  case 2:
    bVar1 = field->field_0x1;
    bVar10 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar10) {
      psVar9 = (string *)0x0;
    }
    else {
      psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                         (bVar10,0xbf < bVar1,"is_repeated_ == label() == LABEL_REPEATED");
    }
    if (psVar9 == (string *)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        sVar8 = Reflection::GetInt64(reflection,options,field);
      }
      else {
        sVar8 = Reflection::GetRepeatedInt64(reflection,options,field,index);
      }
      Int64Value::Int64Value((Int64Value *)local_b0,(Arena *)0x0);
      local_a0._M_allocated_capacity = sVar8;
      Any::PackFrom(pAVar5,(Message *)local_b0);
      Int64Value::~Int64Value((Int64Value *)local_b0);
      return;
    }
    goto LAB_0032fc09;
  case 3:
    bVar1 = field->field_0x1;
    bVar10 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar10) {
      psVar9 = (string *)0x0;
    }
    else {
      psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                         (bVar10,0xbf < bVar1,"is_repeated_ == label() == LABEL_REPEATED");
    }
    if (psVar9 == (string *)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        uVar4 = Reflection::GetUInt32(reflection,options,field);
      }
      else {
        uVar4 = Reflection::GetRepeatedUInt32(reflection,options,field,index);
      }
      UInt32Value::UInt32Value((UInt32Value *)local_b0,(Arena *)0x0);
      local_a0._M_allocated_capacity._0_4_ = uVar4;
      Any::PackFrom(pAVar5,(Message *)local_b0);
      UInt32Value::~UInt32Value((UInt32Value *)local_b0);
      return;
    }
    goto LAB_0032fbd5;
  case 4:
    bVar1 = field->field_0x1;
    bVar10 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar10) {
      psVar9 = (string *)0x0;
    }
    else {
      psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                         (bVar10,0xbf < bVar1,"is_repeated_ == label() == LABEL_REPEATED");
    }
    if (psVar9 == (string *)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        uVar6 = Reflection::GetUInt64(reflection,options,field);
      }
      else {
        uVar6 = Reflection::GetRepeatedUInt64(reflection,options,field,index);
      }
      UInt64Value::UInt64Value((UInt64Value *)local_b0,(Arena *)0x0);
      local_a0._M_allocated_capacity = uVar6;
      Any::PackFrom(pAVar5,(Message *)local_b0);
      UInt64Value::~UInt64Value((UInt64Value *)local_b0);
      return;
    }
    goto LAB_0032fbef;
  case 5:
    bVar1 = field->field_0x1;
    bVar10 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar10) {
      psVar9 = (string *)0x0;
    }
    else {
      psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                         (bVar10,0xbf < bVar1,"is_repeated_ == label() == LABEL_REPEATED");
    }
    if (psVar9 == (string *)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        local_90 = Reflection::GetDouble(reflection,options,field);
      }
      else {
        local_90 = Reflection::GetRepeatedDouble(reflection,options,field,index);
      }
      DoubleValue::DoubleValue((DoubleValue *)local_b0,(Arena *)0x0);
      local_a0._M_allocated_capacity = (size_type)local_90;
      Any::PackFrom(pAVar5,(Message *)local_b0);
      DoubleValue::~DoubleValue((DoubleValue *)local_b0);
      return;
    }
    _GLOBAL__N_1::ConvertOptionField();
    break;
  case 6:
    bVar1 = field->field_0x1;
    bVar10 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar10) {
      psVar9 = (string *)0x0;
    }
    else {
      psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                         (bVar10,0xbf < bVar1,"is_repeated_ == label() == LABEL_REPEATED");
    }
    if (psVar9 == (string *)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        fVar13 = Reflection::GetFloat(reflection,options,field);
      }
      else {
        fVar13 = Reflection::GetRepeatedFloat(reflection,options,field,index);
      }
      local_90 = (double)CONCAT44(local_90._4_4_,fVar13);
      FloatValue::FloatValue((FloatValue *)local_b0,(Arena *)0x0);
      local_a0._M_allocated_capacity._0_4_ = local_90._0_4_;
      Any::PackFrom(pAVar5,(Message *)local_b0);
      FloatValue::~FloatValue((FloatValue *)local_b0);
      return;
    }
    goto LAB_0032fc16;
  case 7:
    bVar1 = field->field_0x1;
    bVar10 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar10) {
      psVar9 = (string *)0x0;
    }
    else {
      psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                         (bVar10,0xbf < bVar1,"is_repeated_ == label() == LABEL_REPEATED");
    }
    if (psVar9 == (string *)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        bVar10 = Reflection::GetBool(reflection,options,field);
      }
      else {
        bVar10 = Reflection::GetRepeatedBool(reflection,options,field,index);
      }
      BoolValue::BoolValue((BoolValue *)local_b0,(Arena *)0x0);
      local_a0._M_local_buf[0] = bVar10;
      Any::PackFrom(pAVar5,(Message *)local_b0);
      BoolValue::~BoolValue((BoolValue *)local_b0);
      return;
    }
    goto LAB_0032fc23;
  case 8:
    bVar1 = field->field_0x1;
    bVar10 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar10) {
      psVar9 = (string *)0x0;
    }
    else {
      psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                         (bVar10,0xbf < bVar1,"is_repeated_ == label() == LABEL_REPEATED");
    }
    if (psVar9 == (string *)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        pEVar7 = Reflection::GetEnum(reflection,options,field);
      }
      else {
        pEVar7 = Reflection::GetRepeatedEnum(reflection,options,field,index);
      }
      iVar2 = pEVar7->number_;
      Int32Value::Int32Value((Int32Value *)local_b0,(Arena *)0x0);
      local_a0._M_allocated_capacity._0_4_ = iVar2;
      Any::PackFrom(pAVar5,(Message *)local_b0);
      goto LAB_0032f862;
    }
    goto LAB_0032fbfc;
  case 9:
    bVar1 = field->field_0x1;
    bVar10 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar10) {
      psVar9 = (string *)0x0;
    }
    else {
      psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                         (bVar10,0xbf < bVar1,"is_repeated_ == label() == LABEL_REPEATED");
    }
    if (psVar9 == (string *)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        Reflection::GetString_abi_cxx11_((string *)local_b0,reflection,options,field);
      }
      else {
        Reflection::GetRepeatedString_abi_cxx11_((string *)local_b0,reflection,options,field,index);
      }
      if (field->type_ == '\t') {
        local_48._0_8_ = (FieldDescriptor *)(local_48 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_48,local_b0._0_8_,(char *)(local_b0._0_8_ + local_b0._8_8_));
        StringValue::StringValue((StringValue *)local_88,(Arena *)0x0);
        if ((local_88._8_8_ & 1) != 0) {
          local_88._8_8_ = *(undefined8 *)(local_88._8_8_ & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)(local_88 + 0x10),(string *)local_48,(Arena *)local_88._8_8_);
        Any::PackFrom(pAVar5,(Message *)local_88);
        StringValue::~StringValue((StringValue *)local_88);
        local_68.field_2._M_allocated_capacity = local_48._16_8_;
        _Var12._M_p = (pointer)local_48._0_8_;
        if ((FieldDescriptor *)local_48._0_8_ == (FieldDescriptor *)(local_48 + 0x10))
        goto LAB_0032fa48;
      }
      else {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,local_b0._0_8_,(char *)(local_b0._0_8_ + local_b0._8_8_));
        BytesValue::BytesValue((BytesValue *)local_88,(Arena *)0x0);
        if ((local_88._8_8_ & 1) != 0) {
          local_88._8_8_ = *(undefined8 *)(local_88._8_8_ & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)(local_88 + 0x10),&local_68,(Arena *)local_88._8_8_);
        Any::PackFrom(pAVar5,(Message *)local_88);
        BytesValue::~BytesValue((BytesValue *)local_88);
        _Var12._M_p = local_68._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p == &local_68.field_2) goto LAB_0032fa48;
      }
      operator_delete(_Var12._M_p,local_68.field_2._M_allocated_capacity + 1);
LAB_0032fa48:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._0_8_ == &local_a0) {
        return;
      }
      operator_delete((void *)local_b0._0_8_,local_a0._M_allocated_capacity + 1);
      return;
    }
    goto LAB_0032fc30;
  case 10:
    bVar1 = field->field_0x1;
    bVar10 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar10) {
      psVar9 = (string *)0x0;
    }
    else {
      psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                         (bVar10,0xbf < bVar1,"is_repeated_ == label() == LABEL_REPEATED");
    }
    if (psVar9 == (string *)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        message = Reflection::GetMessage(reflection,options,field,(MessageFactory *)0x0);
      }
      else {
        message = Reflection::GetRepeatedMessage(reflection,options,field,index);
      }
      Any::PackFrom(pAVar5,message);
      return;
    }
  }
  _GLOBAL__N_1::ConvertOptionField();
LAB_0032fbd5:
  _GLOBAL__N_1::ConvertOptionField();
LAB_0032fbe2:
  _GLOBAL__N_1::ConvertOptionField();
LAB_0032fbef:
  _GLOBAL__N_1::ConvertOptionField();
LAB_0032fbfc:
  _GLOBAL__N_1::ConvertOptionField();
LAB_0032fc09:
  _GLOBAL__N_1::ConvertOptionField();
LAB_0032fc16:
  _GLOBAL__N_1::ConvertOptionField();
LAB_0032fc23:
  _GLOBAL__N_1::ConvertOptionField();
LAB_0032fc30:
  _GLOBAL__N_1::ConvertOptionField();
  BytesValue::~BytesValue((BytesValue *)local_88);
  if ((FieldDescriptor *)local_68._M_dataplus._M_p != field) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._0_8_ != &local_a0) {
    operator_delete((void *)local_b0._0_8_,local_a0._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void ConvertOptionField(const Reflection* reflection, const Message& options,
                        const FieldDescriptor* field, int index, Option* out) {
  out->set_name(field->is_extension() ? field->full_name() : field->name());
  Any* value = out->mutable_value();
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_MESSAGE:
      value->PackFrom(
          field->is_repeated()
              ? reflection->GetRepeatedMessage(options, field, index)
              : reflection->GetMessage(options, field));
      return;
    case FieldDescriptor::CPPTYPE_DOUBLE:
      value->PackFrom(WrapValue<DoubleValue>(
          field->is_repeated()
              ? reflection->GetRepeatedDouble(options, field, index)
              : reflection->GetDouble(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_FLOAT:
      value->PackFrom(WrapValue<FloatValue>(
          field->is_repeated()
              ? reflection->GetRepeatedFloat(options, field, index)
              : reflection->GetFloat(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_INT64:
      value->PackFrom(WrapValue<Int64Value>(
          field->is_repeated()
              ? reflection->GetRepeatedInt64(options, field, index)
              : reflection->GetInt64(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_UINT64:
      value->PackFrom(WrapValue<UInt64Value>(
          field->is_repeated()
              ? reflection->GetRepeatedUInt64(options, field, index)
              : reflection->GetUInt64(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_INT32:
      value->PackFrom(WrapValue<Int32Value>(
          field->is_repeated()
              ? reflection->GetRepeatedInt32(options, field, index)
              : reflection->GetInt32(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_UINT32:
      value->PackFrom(WrapValue<UInt32Value>(
          field->is_repeated()
              ? reflection->GetRepeatedUInt32(options, field, index)
              : reflection->GetUInt32(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_BOOL:
      value->PackFrom(WrapValue<BoolValue>(
          field->is_repeated()
              ? reflection->GetRepeatedBool(options, field, index)
              : reflection->GetBool(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_STRING: {
      const std::string& val =
          field->is_repeated()
              ? reflection->GetRepeatedString(options, field, index)
              : reflection->GetString(options, field);
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        value->PackFrom(WrapValue<StringValue>(val));
      } else {
        value->PackFrom(WrapValue<BytesValue>(val));
      }
      return;
    }
    case FieldDescriptor::CPPTYPE_ENUM: {
      const EnumValueDescriptor* val =
          field->is_repeated()
              ? reflection->GetRepeatedEnum(options, field, index)
              : reflection->GetEnum(options, field);
      value->PackFrom(WrapValue<Int32Value>(val->number()));
      return;
    }
  }
}